

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

void __thiscall
FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor>::dump_PictureEssenceCoding
          (FileInfoWrapper<AS_02::JP2K::MXFReader,_MyPictureDescriptor> *this,FILE *stream)

{
  FILE *__stream;
  iterator iVar1;
  undefined8 uVar2;
  UL *__k;
  allocator<char> local_79;
  string encoding_ul_type;
  char buf [64];
  
  if ((this->m_PictureEssenceCoding).super_Identifier<16U>.m_HasValue == true) {
    __k = &this->m_PictureEssenceCoding;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encoding_ul_type,"**UNKNOWN**",&local_79);
    iVar1 = std::
            _Rb_tree<const_ASDCP::UL,_std::pair<const_ASDCP::UL,_const_RateInfo>,_std::_Select1st<std::pair<const_ASDCP::UL,_const_RateInfo>_>,_std::less<const_ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_const_RateInfo>_>_>
            ::find(&g_rate_info._M_t,__k);
    __stream = _stderr;
    if ((_Rb_tree_header *)iVar1._M_node == &g_rate_info._M_t._M_impl.super__Rb_tree_header) {
      uVar2 = ASDCP::UL::EncodeString((char *)__k,(uint)buf);
      fprintf(__stream,"Unknown PictureEssenceCoding UL: %s\n",uVar2);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&encoding_ul_type);
    }
    uVar2 = ASDCP::UL::EncodeString((char *)__k,(uint)buf);
    fprintf((FILE *)stream,"PictureEssenceCoding: %s (%s)\n",uVar2,encoding_ul_type._M_dataplus._M_p
           );
    std::__cxx11::string::~string((string *)&encoding_ul_type);
  }
  return;
}

Assistant:

void dump_PictureEssenceCoding(FILE* stream = 0)
  {
    char buf[64];

    if ( m_PictureEssenceCoding.HasValue() )
      {
	std::string encoding_ul_type = "**UNKNOWN**";

	rate_info_map::const_iterator rate_i = g_rate_info.find(m_PictureEssenceCoding);
	if ( rate_i == g_rate_info.end() )
	  {
	    fprintf(stderr, "Unknown PictureEssenceCoding UL: %s\n", m_PictureEssenceCoding.EncodeString(buf, 64));
	  }
	else
	  {
	    encoding_ul_type = rate_i->second.label;
	  }

	fprintf(stream, "PictureEssenceCoding: %s (%s)\n",
		m_PictureEssenceCoding.EncodeString(buf, 64),
		encoding_ul_type.c_str());
      }
  }